

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncapsulatedFileManager.cpp
# Opt level: O3

void __thiscall
supermap::io::EncapsulatedFileManager::swap(EncapsulatedFileManager *this,path *a,path *b)

{
  FileManager *pFVar1;
  path pStack_68;
  path local_40;
  
  pFVar1 = (this->innerManager_)._M_t.
           super___uniq_ptr_impl<supermap::io::FileManager,_std::default_delete<supermap::io::FileManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::io::FileManager_*,_std::default_delete<supermap::io::FileManager>_>
           .super__Head_base<0UL,_supermap::io::FileManager_*,_false>._M_head_impl;
  makeRootPath(&local_40,this,a);
  makeRootPath(&pStack_68,this,b);
  (*pFVar1->_vptr_FileManager[4])(pFVar1,&local_40,&pStack_68);
  std::filesystem::__cxx11::path::~path(&pStack_68);
  std::filesystem::__cxx11::path::~path(&local_40);
  return;
}

Assistant:

void EncapsulatedFileManager::swap(const std::filesystem::path &a, const std::filesystem::path &b) {
    innerManager_->swap(makeRootPath(a), makeRootPath(b));
}